

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5StructureAddLevel(int *pRc,Fts5Structure **ppStruct)

{
  Fts5StructureLevel *pFVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Fts5Structure *__dest;
  void *__dest_00;
  Fts5Structure *pFVar5;
  long lVar6;
  Fts5StructureSegment **ppFVar7;
  long lVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (*pRc != 0) {
    return;
  }
  pFVar5 = *ppStruct;
  if (1 < pFVar5->nRef) {
    sVar9 = (long)pFVar5->nLevel * 0x10 + 0x20;
    __dest = (Fts5Structure *)sqlite3Fts5MallocZero(pRc,sVar9);
    if (__dest != (Fts5Structure *)0x0) {
      memcpy(__dest,pFVar5,sVar9);
      auVar3 = _DAT_001ff0a0;
      iVar2 = pFVar5->nLevel;
      if (0 < (long)iVar2) {
        lVar6 = (long)iVar2 + -1;
        auVar10._8_4_ = (int)lVar6;
        auVar10._0_8_ = lVar6;
        auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar6 = 0;
        auVar10 = auVar10 ^ _DAT_001ff0a0;
        auVar11 = _DAT_001ff090;
        do {
          auVar12 = auVar11 ^ auVar3;
          if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                      auVar10._4_4_ < auVar12._4_4_) & 1)) {
            *(undefined8 *)((long)&__dest->aLevel[0].aSeg + lVar6) = 0;
          }
          if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
              auVar12._12_4_ <= auVar10._12_4_) {
            *(undefined8 *)((long)__dest[1].aLevel + lVar6 + -0x18) = 0;
          }
          lVar8 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar8 + 2;
          lVar6 = lVar6 + 0x20;
        } while ((ulong)(iVar2 + 1U >> 1) << 5 != lVar6);
        lVar8 = 0x28;
        lVar6 = 0;
LAB_001e6f4f:
        sVar9 = (long)*(int *)((long)__dest->aLevel + lVar8 + -0x24) * 0x38;
        __dest_00 = sqlite3Fts5MallocZero(pRc,sVar9);
        *(void **)((long)&((Fts5Structure *)(__dest->aLevel + -2))->nRef + lVar8) = __dest_00;
        if (__dest_00 != (void *)0x0) goto code_r0x001e6f70;
        if (0 < pFVar5->nLevel) {
          ppFVar7 = &__dest->aLevel[0].aSeg;
          lVar6 = 0;
          do {
            sqlite3_free(*ppFVar7);
            lVar6 = lVar6 + 1;
            ppFVar7 = ppFVar7 + 2;
          } while (lVar6 < pFVar5->nLevel);
        }
        sqlite3_free(__dest);
        goto LAB_001e6fa2;
      }
LAB_001e6f8f:
      pFVar5->nRef = pFVar5->nRef + -1;
      __dest->nRef = 1;
    }
    *ppStruct = __dest;
LAB_001e6fa2:
    if (*pRc != 0) {
      return;
    }
    pFVar5 = *ppStruct;
  }
  iVar2 = pFVar5->nLevel;
  iVar4 = sqlite3_initialize();
  if (iVar4 == 0) {
    pFVar5 = (Fts5Structure *)sqlite3Realloc(pFVar5,(long)iVar2 * 0x10 + 0x40);
    if (pFVar5 != (Fts5Structure *)0x0) {
      pFVar1 = pFVar5->aLevel + iVar2;
      pFVar1->nMerge = 0;
      pFVar1->nSeg = 0;
      pFVar1->aSeg = (Fts5StructureSegment *)0x0;
      pFVar5->nLevel = pFVar5->nLevel + 1;
      *ppStruct = pFVar5;
      return;
    }
  }
  *pRc = 7;
  return;
code_r0x001e6f70:
  memcpy(__dest_00,*(void **)((long)&((Fts5Structure *)(pFVar5->aLevel + -2))->nRef + lVar8),sVar9);
  lVar6 = lVar6 + 1;
  lVar8 = lVar8 + 0x10;
  if (pFVar5->nLevel <= lVar6) goto LAB_001e6f8f;
  goto LAB_001e6f4f;
}

Assistant:

static void fts5StructureMakeWritable(int *pRc, Fts5Structure **pp){
  Fts5Structure *p = *pp;
  if( *pRc==SQLITE_OK && p->nRef>1 ){
    i64 nByte = sizeof(Fts5Structure)+(p->nLevel-1)*sizeof(Fts5StructureLevel);
    Fts5Structure *pNew;
    pNew = (Fts5Structure*)sqlite3Fts5MallocZero(pRc, nByte);
    if( pNew ){
      int i;
      memcpy(pNew, p, nByte);
      for(i=0; i<p->nLevel; i++) pNew->aLevel[i].aSeg = 0;
      for(i=0; i<p->nLevel; i++){
        Fts5StructureLevel *pLvl = &pNew->aLevel[i];
        nByte = sizeof(Fts5StructureSegment) * pNew->aLevel[i].nSeg;
        pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(pRc, nByte);
        if( pLvl->aSeg==0 ){
          for(i=0; i<p->nLevel; i++){
            sqlite3_free(pNew->aLevel[i].aSeg);
          }
          sqlite3_free(pNew);
          return;
        }
        memcpy(pLvl->aSeg, p->aLevel[i].aSeg, nByte);
      }
      p->nRef--;
      pNew->nRef = 1;
    }
    *pp = pNew;
  }
}